

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O1

int arkRelaxCreate(ARKodeMem ark_mem,ARKRelaxFn relax_fn,ARKRelaxJacFn relax_jac_fn,
                  ARKRelaxDeltaEFn delta_e_fn,ARKRelaxGetOrderFn get_order_fn)

{
  ARKodeRelaxMem pAVar1;
  int line;
  int iVar2;
  char *msgfmt;
  
  if (relax_fn == (ARKRelaxFn)0x0 && relax_jac_fn == (ARKRelaxJacFn)0x0) {
    ark_mem->relax_enabled = 0;
LAB_0015c165:
    iVar2 = 0;
  }
  else {
    if (relax_fn == (ARKRelaxFn)0x0) {
      msgfmt = "The relaxation function is NULL.";
      line = 0x315;
    }
    else if (relax_jac_fn == (ARKRelaxJacFn)0x0) {
      msgfmt = "The relaxation Jacobian function is NULL.";
      line = 0x31c;
    }
    else {
      if (delta_e_fn != (ARKRelaxDeltaEFn)0x0 && get_order_fn != (ARKRelaxGetOrderFn)0x0) {
        if (ark_mem->relax_mem == (ARKodeRelaxMem)0x0) {
          pAVar1 = (ARKodeRelaxMem)malloc(200);
          ark_mem->relax_mem = pAVar1;
          if (pAVar1 == (ARKodeRelaxMem)0x0) {
            return -0x14;
          }
          memset(pAVar1,0,200);
          pAVar1->max_fails = 10;
          pAVar1->upper_bound = 1.2;
          pAVar1->eta_fail = 0.25;
          pAVar1->solver = ARK_RELAX_NEWTON;
          pAVar1->res_tol = 2.220446049250313e-15;
          pAVar1->rel_tol = 8.881784197001252e-16;
          pAVar1->abs_tol = 1e-14;
          pAVar1->max_iters = 10;
          pAVar1->relax_param_prev = 1.0;
          pAVar1->lower_bound = 0.8;
          ark_mem->lrw = ark_mem->lrw + 0xc;
          ark_mem->liw = ark_mem->liw + 0xe;
        }
        pAVar1 = ark_mem->relax_mem;
        pAVar1->relax_fn = relax_fn;
        pAVar1->relax_jac_fn = relax_jac_fn;
        pAVar1->delta_e_fn = delta_e_fn;
        pAVar1->get_order_fn = get_order_fn;
        ark_mem->relax_enabled = 1;
        goto LAB_0015c165;
      }
      msgfmt = "The Delta y, Delta e, or get order function is NULL.";
      line = 0x324;
    }
    iVar2 = -0x16;
    arkProcessError(ark_mem,-0x16,line,"arkRelaxCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,msgfmt);
  }
  return iVar2;
}

Assistant:

int arkRelaxCreate(ARKodeMem ark_mem, ARKRelaxFn relax_fn,
                   ARKRelaxJacFn relax_jac_fn, ARKRelaxDeltaEFn delta_e_fn,
                   ARKRelaxGetOrderFn get_order_fn)
{
  /* Disable relaxation if both user inputs are NULL */
  if (!relax_fn && !relax_jac_fn)
  {
    ark_mem->relax_enabled = SUNFALSE;
    return ARK_SUCCESS;
  }

  /* Ensure both the relaxation function and Jacobian are provided */
  if (!relax_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The relaxation function is NULL.");
    return ARK_ILL_INPUT;
  }

  if (!relax_jac_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian function is NULL.");
    return ARK_ILL_INPUT;
  }

  /* Ensure stepper supplied inputs are provided */
  if (!delta_e_fn || !get_order_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The Delta y, Delta e, or get order function is NULL.");
    return ARK_ILL_INPUT;
  }

  /* Allocate and initialize relaxation memory structure */
  if (!(ark_mem->relax_mem))
  {
    ark_mem->relax_mem = (ARKodeRelaxMem)malloc(sizeof(*(ark_mem->relax_mem)));
    if (!(ark_mem->relax_mem)) { return ARK_MEM_FAIL; }
    memset(ark_mem->relax_mem, 0, sizeof(struct ARKodeRelaxMemRec));

    /* Set defaults */
    ark_mem->relax_mem->max_fails   = ARK_RELAX_DEFAULT_MAX_FAILS;
    ark_mem->relax_mem->lower_bound = ARK_RELAX_DEFAULT_LOWER_BOUND;
    ark_mem->relax_mem->upper_bound = ARK_RELAX_DEFAULT_UPPER_BOUND;
    ark_mem->relax_mem->eta_fail    = ARK_RELAX_DEFAULT_ETA_FAIL;
    ark_mem->relax_mem->solver      = ARK_RELAX_NEWTON;
    ark_mem->relax_mem->res_tol     = ARK_RELAX_DEFAULT_RES_TOL;
    ark_mem->relax_mem->rel_tol     = ARK_RELAX_DEFAULT_REL_TOL;
    ark_mem->relax_mem->abs_tol     = ARK_RELAX_DEFAULT_ABS_TOL;
    ark_mem->relax_mem->max_iters   = ARK_RELAX_DEFAULT_MAX_ITERS;

    /* Initialize values */
    ark_mem->relax_mem->relax_param_prev = ONE;

    /* Update workspace sizes */
    ark_mem->lrw += 12;
    ark_mem->liw += 14;
  }

  /* Set function pointers */
  ark_mem->relax_mem->relax_fn     = relax_fn;
  ark_mem->relax_mem->relax_jac_fn = relax_jac_fn;
  ark_mem->relax_mem->delta_e_fn   = delta_e_fn;
  ark_mem->relax_mem->get_order_fn = get_order_fn;

  /* Enable relaxation */
  ark_mem->relax_enabled = SUNTRUE;

  return ARK_SUCCESS;
}